

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O0

IssuePtr __thiscall libcellml::Logger::message(Logger *this,size_t index)

{
  LoggerImpl *pLVar1;
  size_type sVar2;
  LoggerImpl *pLVar3;
  const_reference pvVar4;
  const_reference pvVar5;
  ulong in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  IssuePtr IVar7;
  size_t index_local;
  Logger *this_local;
  IssuePtr *issue;
  
  std::shared_ptr<libcellml::Issue>::shared_ptr((shared_ptr<libcellml::Issue> *)this,(nullptr_t)0x0)
  ;
  pLVar1 = pFunc((Logger *)index);
  sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&pLVar1->mMessages);
  _Var6._M_pi = extraout_RDX;
  if (in_RDX < sVar2) {
    pLVar1 = pFunc((Logger *)index);
    pLVar3 = pFunc((Logger *)index);
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                       (&pLVar3->mMessages,in_RDX);
    pvVar5 = std::
             vector<std::shared_ptr<libcellml::Issue>,_std::allocator<std::shared_ptr<libcellml::Issue>_>_>
             ::at(&pLVar1->mIssues,*pvVar4);
    std::shared_ptr<libcellml::Issue>::operator=((shared_ptr<libcellml::Issue> *)this,pvVar5);
    _Var6._M_pi = extraout_RDX_00;
  }
  IVar7.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var6._M_pi;
  IVar7.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (IssuePtr)IVar7.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

IssuePtr Logger::message(size_t index) const
{
    IssuePtr issue = nullptr;
    if (index < pFunc()->mMessages.size()) {
        issue = pFunc()->mIssues.at(pFunc()->mMessages.at(index));
    }
    return issue;
}